

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

void duckdb::NextValFunction<duckdb::CurrentSequenceValueOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  BoundFunctionExpression *pBVar2;
  FunctionLocalState *pFVar3;
  int64_t iVar4;
  idx_t i;
  ulong uVar5;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar2->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl != (FunctionData *)0x0) {
    local_28.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
    pFVar3 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_28);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    for (uVar5 = 0; uVar5 < args->count; uVar5 = uVar5 + 1) {
      iVar4 = SequenceCatalogEntry::CurrentValue
                        ((SequenceCatalogEntry *)pFVar3[2]._vptr_FunctionLocalState);
      *(int64_t *)(pdVar1 + uVar5 * 8) = iVar4;
    }
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void NextValFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (!func_expr.bind_info) {
		// no bind info - return null
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<NextValLocalState>();
	// sequence to use is hard coded
	// increment the sequence
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<int64_t>(result);
	for (idx_t i = 0; i < args.size(); i++) {
		// get the next value from the sequence
		result_data[i] = OP::Operation(lstate.transaction, lstate.sequence);
	}
}